

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O3

string * std::
         format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::basic_string_view<char,std::char_traits<char>>&>
                   (string *__return_storage_ptr__,string_view fmt,char *ts,
                   time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *ts_1,basic_string_view<char,_std::char_traits<char>_> *ts_2)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  stringstream ss;
  char local_3c9;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_3c8;
  char *local_3c0;
  size_t local_3b8;
  char *local_3b0;
  long local_3a8;
  char *local_3a0;
  long local_398;
  char *local_390;
  long alStack_388 [58];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar4 = fmt._M_str;
  sVar8 = fmt._M_len;
  uVar6 = 0;
  local_3c8 = ts_1;
  local_3c0 = ts;
  memset(&local_3b8,0,0x200);
  pcVar2 = pcVar4;
  if (sVar8 != 0) {
    sVar5 = 0;
    uVar6 = 0;
    pcVar1 = pcVar4;
    do {
      pcVar2 = pcVar4 + sVar5;
      if ((pcVar4[sVar5] != '}') && (pcVar2 = pcVar1, pcVar4[sVar5] == '{')) {
        if (pcVar1 == pcVar4) {
          (&local_3b8)[uVar6 * 2] = sVar5;
          (&local_3b0)[uVar6 * 2] = pcVar4;
          pcVar2 = pcVar4;
          uVar6 = uVar6 + 1;
        }
        else if (uVar6 < 0x20 && pcVar4 + sVar5 != pcVar1) {
          (&local_3b8)[uVar6 * 2] = (size_t)(pcVar4 + ((sVar5 - 1) - (long)pcVar1));
          (&local_3b0)[uVar6 * 2] = pcVar1 + 1;
          uVar6 = uVar6 + 1;
        }
      }
      sVar5 = sVar5 + 1;
      pcVar1 = pcVar2;
    } while (sVar8 != sVar5);
  }
  pcVar2 = pcVar2 + 1;
  if (pcVar2 != pcVar4 + sVar8) {
    (&local_3b8)[uVar6 * 2] = (long)(pcVar4 + sVar8) - (long)pcVar2;
    (&local_3b0)[uVar6 * 2] = pcVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,local_3b8);
  local_3c9 = *local_3c0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_3c9,1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3a0,local_3a8);
  webfront::operator<<
            (poVar3,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     )(local_3c8->__d).__r);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_390,local_398);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,ts_2->_M_str,ts_2->_M_len);
  for (lVar7 = 0x38; lVar7 != 0x208; lVar7 = lVar7 + 0x10) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)&local_3b8 + lVar7),*(long *)((long)&local_3c0 + lVar7));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}